

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

sunrealtype N_VMinQuotientLocal_ManyVector(N_Vector num,N_Vector denom)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  plVar2 = (long *)num->content;
  if (*plVar2 < 1) {
    dVar4 = 1.79769313486232e+308;
  }
  else {
    dVar4 = 1.79769313486232e+308;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(plVar2[2] + lVar3 * 8);
      if (*(long *)(*(long *)(lVar1 + 8) + 0x170) == 0) {
        dVar5 = (double)N_VMinQuotient(lVar1,*(undefined8 *)
                                              (*(long *)((long)denom->content + 0x10) + lVar3 * 8));
      }
      else {
        dVar5 = (double)N_VMinQuotientLocal();
      }
      if (dVar5 <= dVar4) {
        dVar4 = dVar5;
      }
      lVar3 = lVar3 + 1;
      plVar2 = (long *)num->content;
    } while (lVar3 < *plVar2);
  }
  return dVar4;
}

Assistant:

sunrealtype MVAPPEND(N_VMinQuotientLocal)(N_Vector num, N_Vector denom)
{
  SUNFunctionBegin(num->sunctx);
  sunindextype i;
  sunrealtype min, lmin;

  /* initialize output*/
  min = SUN_BIG_REAL;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(num); i++)
  {
    /* check for nvminquotientlocal in subvector */
    if (MANYVECTOR_SUBVEC(num, i)->ops->nvminquotientlocal)
    {
      lmin = N_VMinQuotientLocal(MANYVECTOR_SUBVEC(num, i),
                                 MANYVECTOR_SUBVEC(denom, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;

      /* otherwise, call nvmin and accumulate to overall min */
    }
    else
    {
      lmin = N_VMinQuotient(MANYVECTOR_SUBVEC(num, i),
                            MANYVECTOR_SUBVEC(denom, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;
    }
  }

  return (min);
}